

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void on_request(http_s *request)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  fiobj_object_vtable_s *pfVar4;
  uint uVar5;
  uint uVar6;
  uintptr_t length;
  char *data;
  fio_str_info_s ret;
  fio_str_info_s local_28;
  
  uVar1 = request->method;
  if (uVar1 == 0) {
LAB_001050b0:
    local_28.data = anon_var_dwarf_1dd;
    local_28.len._0_4_ = 4;
    goto LAB_001050c3;
  }
  if ((uVar1 & 1) != 0) {
    fio_ltocstr(&local_28,(long)uVar1 >> 1);
    goto LAB_0010515d;
  }
  uVar5 = (uint)uVar1 & 6;
  cVar2 = '(';
  switch(uVar5) {
  case 0:
switchD_0010507f_caseD_0:
    cVar2 = *(char *)(uVar1 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0010507f_caseD_4:
    cVar2 = '*';
    break;
  case 6:
    if ((char)uVar1 == '&') {
      local_28.data = anon_var_dwarf_1e8;
      local_28.len._0_4_ = 5;
    }
    else {
      uVar6 = (uint)uVar1 & 0xff;
      if (uVar6 != 0x16) {
        if (uVar6 == 6) goto LAB_001050b0;
        switch(uVar5) {
        case 0:
          goto switchD_0010507f_caseD_0;
        case 4:
          goto switchD_0010507f_caseD_4;
        case 6:
          cVar2 = (char)uVar1;
        }
        break;
      }
      local_28.data = anon_var_dwarf_1f3;
      local_28.len._0_4_ = 4;
    }
LAB_001050c3:
    local_28.capa._0_4_ = 0;
    local_28.capa._4_4_ = 0;
    local_28.len._4_4_ = 0;
    goto LAB_0010515d;
  }
  switch(cVar2) {
  case '\'':
    pfVar4 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar4 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar4 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar4 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar4 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar4 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar4->to_str)(&local_28,uVar1);
LAB_0010515d:
  iVar3 = strcmp("POST",local_28.data);
  if (iVar3 == 0) {
    iVar3 = request_contains_shutdown_token(request);
    if (iVar3 != 0) {
      http_send_body(request,"{\"status\": 0}\r\n",0xf);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x47,"Shutting down!");
      system("sudo shutdown -h now");
      return;
    }
    data = "{\"status\": -1}\r\n";
    length = 0x10;
  }
  else {
    data = "{\"status\": 1}\r\n";
    length = 0xf;
  }
  http_send_body(request,data,length);
  return;
}

Assistant:

void on_request(http_s *request) {
  /* honour non-POST requests with HTTP 200 */
  if (strcmp("POST", fiobj_obj2cstr(request->method).data)) {
    http_send_body(request, "{\"status\": 1}\r\n", 15);
    return;
  }

  /* shutdown only if body is JSON object {"token": "<RSHUTDOWN_TOKEN_ENV_VAR>"} */
  if (request_contains_shutdown_token(request)) {
      http_send_body(request, "{\"status\": 0}\r\n", 15);
#ifdef NO_SHUTDOWN
      log_info("NO_SHUTDOWN set - not shutting down");
#else
      log_info("Shutting down!");
      system("sudo shutdown -h now");
#endif
  }
  else {
      http_send_body(request, "{\"status\": -1}\r\n", 16);
  }
}